

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_uastc_enc.cpp
# Opt level: O0

bool basisu::uastc_rdo_blocks
               (uint32_t first_index,uint32_t last_index,uastc_block *pBlocks,
               color_rgba *pBlock_pixels,uastc_rdo_params *params,uint32_t flags,
               uint32_t *total_skipped,uint32_t *total_refined,uint32_t *total_modified,
               uint32_t *total_smooth)

{
  double dVar1;
  bool bVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t *total_results_00;
  reference ppVar5;
  pointer ppVar6;
  undefined8 *puVar7;
  long in_RCX;
  long in_RDX;
  uint in_ESI;
  uint in_EDI;
  uint *in_R8;
  float fVar8;
  float fVar9;
  __enable_if_t<is_constructible<value_type,_pair<selector_bitsequence,_unsigned_int>_&&>::value,_pair<iterator,_bool>_>
  _Var10;
  int *in_stack_00000008;
  int *in_stack_00000010;
  int *in_stack_00000018;
  int *in_stack_00000020;
  __enable_if_t<is_constructible<value_type,_pair<selector_bitsequence,_unsigned_int>_&&>::value,_pair<iterator,_bool>_>
  res_1;
  uint64_t sel_bits_1;
  uint32_t bit_offset_1;
  uint32_t i_7;
  uint32_t i_6;
  uint64_t trial_uastc_err_1;
  bool success;
  color_rgba decoded_trial_uastc_block_1 [4] [4];
  uint32_t total_results;
  uastc_encode_results results;
  bc7enc_compress_block_params comp_params;
  uint32_t i_5;
  uint64_t best_uastc_err;
  color_rgba decoded_best_uastc_block [4] [4];
  unpacked_uastc_block unpacked_best_blk;
  float t;
  int match_bits;
  int block_dist_in_bytes_1;
  float trial_rms_err;
  float trial_ms_err;
  uint64_t trial_err;
  uint32_t i_4;
  uint64_t trial_bc7_err;
  color_rgba decoded_trial_b7_blk [4] [4];
  bc7_block trial_b7_block;
  bc7_optimization_results trial_b7_results;
  uint32_t i_3;
  uint64_t trial_uastc_err;
  color_rgba decoded_trial_uastc_block [4] [4];
  unpacked_uastc_block unpacked_trial_blk;
  uastc_block trial_blk;
  unpacked_uastc_block unpacked_prev_blk;
  iterator res;
  int match_block_index_1;
  uint64_t sel_bits;
  uint32_t bit_offset;
  uastc_block *prev_blk;
  int prev_block_index;
  float best_t;
  uint32_t best_block_index;
  uastc_block best_block;
  int last_block_to_check;
  int first_block_to_check;
  int block_dist_in_bytes;
  uint32_t match_block_index;
  iterator cur_find_res;
  int cur_bits;
  __enable_if_t<is_constructible<value_type,_pair<selector_bitsequence,_unsigned_int>_&&>::value,_pair<iterator,_bool>_>
  cur_search_res;
  uint64_t cur_sel_bits;
  uint32_t cur_bit_offset;
  uint32_t total_sel_bits;
  uint32_t first_sel_bit;
  float cur_rms_err;
  float cur_ms_err;
  uint64_t cur_err;
  uint32_t i_2;
  uint64_t bc7_err;
  color_rgba decoded_b7_blk [4] [4];
  bc7_block b7_block;
  bc7_optimization_results b7_results;
  uint32_t i_1;
  uint64_t uastc_err;
  color_rgba decoded_uastc_block [4] [4];
  float smooth_block_error_scale;
  float yl;
  float max_std_dev;
  uint32_t i;
  tracked_stat a_stats;
  tracked_stat b_stats;
  tracked_stat g_stats;
  tracked_stat r_stats;
  uint32_t block_mode;
  unpacked_uastc_block unpacked_blk;
  color_rgba *pPixels;
  uastc_block *blk;
  uint32_t block_index;
  unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
  selector_history;
  bool perceptual;
  int total_blocks_to_check;
  unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
  *in_stack_fffffffffffff5a8;
  uint in_stack_fffffffffffff5b0;
  uint32_t in_stack_fffffffffffff5b4;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
  in_stack_fffffffffffff5b8;
  tracked_stat *in_stack_fffffffffffff5c0;
  uint32_t codesize;
  undefined4 in_stack_fffffffffffff5c8;
  uint in_stack_fffffffffffff5cc;
  undefined4 in_stack_fffffffffffff5d0;
  uint32_t in_stack_fffffffffffff5d4;
  undefined4 in_stack_fffffffffffff5d8;
  undefined4 in_stack_fffffffffffff5dc;
  uint32_t in_stack_fffffffffffff5e0;
  color_rgba *local_a08;
  color_rgba *local_9e8;
  color_rgba *local_9b8;
  color_rgba *this;
  uint in_stack_fffffffffffff6c8;
  undefined2 in_stack_fffffffffffff6cc;
  undefined1 in_stack_fffffffffffff6ce;
  undefined1 in_stack_fffffffffffff6cf;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
  in_stack_fffffffffffff6d0;
  uint in_stack_fffffffffffff6d8;
  undefined4 in_stack_fffffffffffff6dc;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
  in_stack_fffffffffffff6e0;
  uastc_encode_results *pResults;
  undefined4 in_stack_fffffffffffff6f8;
  color_rgba *local_8e0;
  anon_union_4_2_6eba8969_for_color_rgba_0 *local_8b8;
  undefined1 in_stack_fffffffffffff780;
  undefined7 in_stack_fffffffffffff781;
  uint32_t in_stack_fffffffffffff78c;
  color_rgba *in_stack_fffffffffffff790;
  uastc_block *in_stack_fffffffffffff798;
  uint in_stack_fffffffffffff7d0;
  uint in_stack_fffffffffffff7d4;
  unpacked_uastc_block *in_stack_fffffffffffff7d8;
  color_rgba local_818 [13];
  undefined1 in_stack_fffffffffffff81f;
  color32 *in_stack_fffffffffffff820;
  astc_block_desc *in_stack_fffffffffffff828;
  undefined4 in_stack_fffffffffffff830;
  int iVar11;
  undefined4 uVar12;
  undefined4 local_7c8;
  uint32_t in_stack_fffffffffffff83c;
  uint32_t in_stack_fffffffffffff840;
  char acStack_799 [81];
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  uint local_724;
  unpacked_uastc_block *local_720;
  color_rgba local_718 [16];
  color_rgba acStack_6d8 [3];
  undefined1 local_6cc [39];
  char local_6a5 [113];
  float local_634;
  uint32_t local_630;
  int local_62c;
  float local_628;
  float local_624;
  ulong local_620;
  uint local_614;
  long local_610;
  color_rgba local_608 [16];
  color_rgba local_5c8 [29];
  uint local_554;
  long local_550;
  color_rgba local_548 [16];
  color_rgba acStack_508 [40];
  undefined8 local_468;
  undefined8 uStack_460;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_3c0;
  selector_bitsequence local_3b8;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_3a8;
  uint local_39c;
  uint64_t local_398;
  uint32_t local_38c;
  long local_388;
  uint local_37c;
  float local_378;
  uint local_374;
  undefined8 local_370;
  undefined8 local_368;
  uint local_360;
  int local_35c;
  int local_358;
  uint local_354;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_350;
  selector_bitsequence local_348;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_338;
  uint local_32c;
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_328;
  undefined1 local_320;
  selector_bitsequence local_318 [2];
  _Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false> local_2f0;
  undefined1 local_2e8;
  uint32_t *local_2e0;
  uint local_2d4;
  uint local_2d0;
  uint local_2cc;
  float local_2c8;
  float local_2c4;
  ulong local_2c0;
  uint local_2b4;
  long local_2b0;
  color_rgba local_2a8 [16];
  color_rgba local_268 [29];
  uint local_1f4;
  long local_1f0;
  anon_union_4_2_6eba8969_for_color_rgba_0 local_1e8 [16];
  anon_union_4_2_6eba8969_for_color_rgba_0 local_1a8;
  float local_1a4;
  float local_1a0;
  uint local_19c;
  tracked_stat local_198;
  tracked_stat local_180;
  tracked_stat local_168;
  tracked_stat local_150;
  uint local_134;
  undefined4 local_130;
  uint local_b8;
  long local_88;
  uastc_encode_results *local_80;
  uint local_74;
  undefined1 local_31;
  uint local_30;
  uint *local_28;
  long local_20;
  long local_18;
  uint local_c;
  uint local_8;
  byte local_1;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_EDI;
  debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n",(ulong)in_EDI,(ulong)in_ESI);
  local_30 = maximum<unsigned_int>(1,*local_28 >> 4);
  local_31 = 0;
  std::
  unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
  ::unordered_map((unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
                   *)0x538787);
  local_74 = local_8;
  do {
    if (local_c <= local_74) {
      local_1 = 1;
LAB_00539edb:
      local_130 = 1;
      std::
      unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
      ::~unordered_map((unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
                        *)0x539ee8);
      return (bool)(local_1 & 1);
    }
    local_80 = (uastc_encode_results *)(local_18 + (ulong)local_74 * 0x10);
    local_88 = local_20 + (ulong)(local_74 << 4) * 4;
    basist::unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x5387f2);
    bVar2 = basist::unpack_uastc
                      ((uastc_block *)CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                       (unpacked_uastc_block *)in_stack_fffffffffffff6d0._M_cur,
                       (bool)in_stack_fffffffffffff6cf,(bool)in_stack_fffffffffffff6ce);
    if (!bVar2) {
      local_1 = 0;
      goto LAB_00539edb;
    }
    local_134 = local_b8;
    if (local_b8 != 8) {
      tracked_stat::tracked_stat((tracked_stat *)0x53888e);
      tracked_stat::tracked_stat((tracked_stat *)0x53889d);
      tracked_stat::tracked_stat((tracked_stat *)0x5388ac);
      tracked_stat::tracked_stat((tracked_stat *)0x5388bb);
      for (local_19c = 0; local_19c < 0x10; local_19c = local_19c + 1) {
        tracked_stat::update(&local_150,(uint)*(byte *)(local_88 + (ulong)local_19c * 4));
        tracked_stat::update(&local_168,(uint)*(byte *)(local_88 + 1 + (ulong)local_19c * 4));
        tracked_stat::update(&local_180,(uint)*(byte *)(local_88 + 2 + (ulong)local_19c * 4));
        tracked_stat::update(&local_198,(uint)*(byte *)(local_88 + 3 + (ulong)local_19c * 4));
      }
      fVar8 = tracked_stat::get_std_dev(in_stack_fffffffffffff5c0);
      fVar9 = tracked_stat::get_std_dev(in_stack_fffffffffffff5c0);
      fVar8 = maximum<float>(fVar8,fVar9);
      fVar9 = tracked_stat::get_std_dev(in_stack_fffffffffffff5c0);
      fVar8 = maximum<float>(fVar8,fVar9);
      fVar9 = tracked_stat::get_std_dev(in_stack_fffffffffffff5c0);
      local_1a0 = maximum<float>(fVar8,fVar9);
      local_1a4 = clamp<float>(local_1a0 / (float)local_28[5],0.0,1.0);
      local_1a4 = local_1a4 * local_1a4;
      local_1a8 = (anon_union_4_2_6eba8969_for_color_rgba_0)
                  lerp<float,float>((float)local_28[6],1.0,local_1a4);
      if (1.0 < (float)local_1a8) {
        *in_stack_00000020 = *in_stack_00000020 + 1;
      }
      local_8b8 = local_1e8;
      do {
        color_rgba::color_rgba((color_rgba *)&local_8b8->field_1);
        local_8b8 = local_8b8 + 1;
      } while (local_8b8 != &local_1a8);
      bVar2 = basist::unpack_uastc
                        ((unpacked_uastc_block *)
                         CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                         (color32 *)in_stack_fffffffffffff5a8,false);
      if (!bVar2) {
        local_1 = 0;
        goto LAB_00539edb;
      }
      local_1f0 = 0;
      for (local_1f4 = 0; local_1f4 < 0x10; local_1f4 = local_1f4 + 1) {
        uVar3 = color_distance(SUB41(in_stack_fffffffffffff5e0 >> 0x18,0),
                               (color_rgba *)
                               CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                               (color_rgba *)
                               CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                               SUB41(in_stack_fffffffffffff5cc >> 0x18,0));
        local_1f0 = (ulong)uVar3 + local_1f0;
      }
      bVar2 = basist::transcode_uastc_to_bc7
                        (in_stack_fffffffffffff7d8,
                         (bc7_optimization_results *)
                         CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
      if (!bVar2) {
        local_1 = 0;
        goto LAB_00539edb;
      }
      basist::encode_bc7_block
                (in_stack_fffffffffffff6d0._M_cur,
                 (bc7_optimization_results *)
                 CONCAT17(in_stack_fffffffffffff6cf,
                          CONCAT16(in_stack_fffffffffffff6ce,
                                   CONCAT24(in_stack_fffffffffffff6cc,in_stack_fffffffffffff6c8))));
      local_8e0 = local_2a8;
      do {
        color_rgba::color_rgba(local_8e0);
        local_8e0 = local_8e0 + 1;
      } while (local_8e0 != local_268);
      unpack_block((texture_format)in_stack_fffffffffffff5c0,in_stack_fffffffffffff5b8._M_cur,
                   (color_rgba *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
      local_2b0 = 0;
      for (local_2b4 = 0; local_2b4 < 0x10; local_2b4 = local_2b4 + 1) {
        uVar3 = color_distance(SUB41(in_stack_fffffffffffff5e0 >> 0x18,0),
                               (color_rgba *)
                               CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                               (color_rgba *)
                               CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                               SUB41(in_stack_fffffffffffff5cc >> 0x18,0));
        local_2b0 = (ulong)uVar3 + local_2b0;
      }
      local_2c0 = (ulong)(local_1f0 + local_2b0) >> 1;
      fVar8 = (float)local_2c0;
      local_2c4 = fVar8 * 0.015625;
      dVar1 = std::sqrt((double)(ulong)(uint)local_2c4);
      local_2c8 = SUB84(dVar1,0);
      local_2cc = (uint)(byte)g_uastc_mode_selector_bits[(ulong)local_134 * 2];
      local_2d0 = (uint)(byte)g_uastc_mode_selector_bits[(ulong)local_134 * 2 + 1];
      if (0x80 < local_2cc + local_2d0) {
        __assert_fail("first_sel_bit + total_sel_bits <= 128",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                      ,0xf53,
                      "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                     );
      }
      if (local_2d0 == 0) {
        __assert_fail("total_sel_bits > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                      ,0xf54,
                      "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                     );
      }
      pResults = local_80;
      local_2d4 = local_2cc;
      uVar4 = minimum<unsigned_int>(0x40,local_2d0);
      total_results_00 =
           (uint32_t *)
           read_bits((uint8_t *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                     (uint32_t *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                     (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
      local_2e0 = total_results_00;
      if (local_2c8 < (float)local_28[3]) {
        selector_bitsequence::selector_bitsequence(&local_348,local_2cc,(uint64_t)total_results_00);
        in_stack_fffffffffffff6d0._M_cur =
             (__node_type *)
             std::
             unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
             ::find(in_stack_fffffffffffff5a8,(key_type *)0x539051);
        local_338._M_cur = in_stack_fffffffffffff6d0._M_cur;
        local_350._M_cur =
             (__node_type *)
             std::
             unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
             ::end(in_stack_fffffffffffff5a8);
        bVar2 = std::__detail::operator==(&local_338,&local_350);
        if (bVar2) {
          local_32c = (local_2d0 * local_28[7]) / 100;
        }
        else {
          ppVar6 = std::__detail::
                   _Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                                 *)0x5390cd);
          local_354 = ppVar6->second;
          local_358 = (local_74 - local_354) * 0x10;
          local_32c = compute_match_cost_estimate(in_stack_fffffffffffff5b4);
          in_stack_fffffffffffff6cc = (undefined2)local_32c;
          in_stack_fffffffffffff6ce = (undefined1)(local_32c >> 0x10);
          in_stack_fffffffffffff6cf = (undefined1)(local_32c >> 0x18);
        }
        local_35c = maximum<int>(local_8,local_74 - local_30);
        local_370._0_4_ = local_80->m_uastc_mode;
        local_370._4_4_ = local_80->m_common_pattern;
        local_368._0_4_ = (local_80->m_astc).m_weight_range;
        local_368._4_4_ = (local_80->m_astc).m_subsets;
        local_374 = local_74;
        local_378 = local_2c4 * (float)local_1a8 + (float)(int)local_32c * (float)local_28[1];
        local_37c = local_74 - 1;
        local_360 = local_37c;
        for (; local_35c <= (int)local_37c; local_37c = local_37c - 1) {
          local_388 = local_18 + (long)(int)local_37c * 0x10;
          local_38c = local_2cc;
          in_stack_fffffffffffff6c8 = minimum<unsigned_int>(0x40,local_2d0);
          local_398 = read_bits((uint8_t *)
                                CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                                (uint32_t *)
                                CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                                (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
          local_39c = local_37c;
          selector_bitsequence::selector_bitsequence(&local_3b8,local_2cc,local_398);
          local_3a8._M_cur =
               (__node_type *)
               std::
               unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
               ::find(in_stack_fffffffffffff5a8,(key_type *)0x539298);
          local_3c0._M_cur =
               (__node_type *)
               std::
               unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
               ::end(in_stack_fffffffffffff5a8);
          bVar2 = std::__detail::operator!=(&local_3a8,&local_3c0);
          if (bVar2) {
            ppVar6 = std::__detail::
                     _Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                     ::operator->((_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                                   *)0x5392ef);
            local_39c = ppVar6->second;
          }
          if ((int)local_39c <= (int)local_37c) {
            basist::unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x53931b);
            bVar2 = basist::unpack_uastc
                              ((uastc_block *)
                               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                               (unpacked_uastc_block *)in_stack_fffffffffffff6d0._M_cur,
                               (bool)in_stack_fffffffffffff6cf,(bool)in_stack_fffffffffffff6ce);
            if (!bVar2) {
              local_1 = 0;
              goto LAB_00539edb;
            }
            local_468._0_4_ = local_80->m_uastc_mode;
            local_468._4_4_ = local_80->m_common_pattern;
            uStack_460._0_4_ = (local_80->m_astc).m_weight_range;
            uStack_460._4_4_ = (local_80->m_astc).m_subsets;
            minimum<unsigned_int>(0x40,local_2d0);
            set_block_bits((uint8_t *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                           CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                           (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20),
                           (uint32_t)in_stack_fffffffffffff5c0);
            if (0x40 < local_2d0) {
              local_398 = read_bits((uint8_t *)
                                    CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                                    (uint32_t *)
                                    CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                                    (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20));
              minimum<unsigned_int>(0x40,local_2d0);
              set_block_bits((uint8_t *)
                             CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                             (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20),
                             (uint32_t)in_stack_fffffffffffff5c0);
            }
            basist::unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x539491);
            bVar2 = basist::unpack_uastc
                              ((uastc_block *)
                               CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                               (unpacked_uastc_block *)in_stack_fffffffffffff6d0._M_cur,
                               (bool)in_stack_fffffffffffff6cf,(bool)in_stack_fffffffffffff6ce);
            if (bVar2) {
              this = local_548;
              do {
                color_rgba::color_rgba(this);
                this = this + 1;
              } while (this != acStack_508);
              bVar2 = basist::unpack_uastc
                                ((unpacked_uastc_block *)
                                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                                 (color32 *)in_stack_fffffffffffff5a8,false);
              if (bVar2) {
                local_550 = 0;
                for (local_554 = 0; local_554 < 0x10; local_554 = local_554 + 1) {
                  uVar3 = color_distance(SUB41(in_stack_fffffffffffff5e0 >> 0x18,0),
                                         (color_rgba *)
                                         CONCAT44(in_stack_fffffffffffff5dc,
                                                  in_stack_fffffffffffff5d8),
                                         (color_rgba *)
                                         CONCAT44(in_stack_fffffffffffff5d4,
                                                  in_stack_fffffffffffff5d0),
                                         SUB41(in_stack_fffffffffffff5cc >> 0x18,0));
                  local_550 = (ulong)uVar3 + local_550;
                }
                bVar2 = basist::transcode_uastc_to_bc7
                                  (in_stack_fffffffffffff7d8,
                                   (bc7_optimization_results *)
                                   CONCAT44(in_stack_fffffffffffff7d4,in_stack_fffffffffffff7d0));
                if (!bVar2) {
                  local_1 = 0;
                  goto LAB_00539edb;
                }
                basist::encode_bc7_block
                          (in_stack_fffffffffffff6d0._M_cur,
                           (bc7_optimization_results *)
                           CONCAT17(in_stack_fffffffffffff6cf,
                                    CONCAT16(in_stack_fffffffffffff6ce,
                                             CONCAT24(in_stack_fffffffffffff6cc,
                                                      in_stack_fffffffffffff6c8))));
                local_9b8 = local_608;
                do {
                  color_rgba::color_rgba(local_9b8);
                  local_9b8 = local_9b8 + 1;
                } while (local_9b8 != local_5c8);
                unpack_block((texture_format)in_stack_fffffffffffff5c0,
                             in_stack_fffffffffffff5b8._M_cur,
                             (color_rgba *)
                             CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
                local_610 = 0;
                for (local_614 = 0; local_614 < 0x10; local_614 = local_614 + 1) {
                  uVar3 = color_distance(SUB41(in_stack_fffffffffffff5e0 >> 0x18,0),
                                         (color_rgba *)
                                         CONCAT44(in_stack_fffffffffffff5dc,
                                                  in_stack_fffffffffffff5d8),
                                         (color_rgba *)
                                         CONCAT44(in_stack_fffffffffffff5d4,
                                                  in_stack_fffffffffffff5d0),
                                         SUB41(in_stack_fffffffffffff5cc >> 0x18,0));
                  local_610 = (ulong)uVar3 + local_610;
                }
                local_620 = (ulong)(local_550 + local_610) >> 1;
                local_624 = (float)local_620 * 0.015625;
                local_628 = sqrtf(local_624);
                if (local_628 <= local_2c8 * (float)local_28[2]) {
                  local_62c = (local_74 - local_39c) * 0x10;
                  local_630 = compute_match_cost_estimate(in_stack_fffffffffffff5b4);
                  local_634 = local_624 * (float)local_1a8 +
                              (float)(int)local_630 * (float)local_28[1];
                  if (local_634 < local_378) {
                    local_374 = local_37c;
                    local_370 = local_468;
                    local_368 = uStack_460;
                    local_378 = local_634;
                  }
                }
              }
            }
          }
        }
        if (local_374 != local_74) {
          *in_stack_00000018 = *in_stack_00000018 + 1;
          basist::unpacked_uastc_block::unpacked_uastc_block((unpacked_uastc_block *)0x5398f3);
          bVar2 = basist::unpack_uastc
                            ((uastc_block *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8),
                             (unpacked_uastc_block *)in_stack_fffffffffffff6d0._M_cur,
                             (bool)in_stack_fffffffffffff6cf,(bool)in_stack_fffffffffffff6ce);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_00539edb;
          }
          if (((local_28[4] & 1) != 0) && (local_134 == 0)) {
            local_9e8 = local_718;
            do {
              color_rgba::color_rgba(local_9e8);
              local_9e8 = local_9e8 + 1;
            } while (local_9e8 != acStack_6d8);
            bVar2 = basist::unpack_uastc
                              ((unpacked_uastc_block *)
                               CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                               (color32 *)in_stack_fffffffffffff5a8,false);
            if (!bVar2) {
              local_1 = 0;
              goto LAB_00539edb;
            }
            local_720 = (unpacked_uastc_block *)0x0;
            for (local_724 = 0; local_724 < 0x10; local_724 = local_724 + 1) {
              uVar3 = color_distance(SUB41(in_stack_fffffffffffff5e0 >> 0x18,0),
                                     (color_rgba *)
                                     CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                                     (color_rgba *)
                                     CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                                     SUB41(in_stack_fffffffffffff5cc >> 0x18,0));
              local_720 = (unpacked_uastc_block *)
                          ((local_720->m_astc).m_endpoints + ((ulong)uVar3 - 0x15));
            }
            uStack_730 = 0x100000000;
            local_748 = 0x100000040;
            uStack_740 = 0x100000001;
            local_738 = 1;
            uastc_encode_results::uastc_encode_results((uastc_encode_results *)0x539abb);
            iVar11 = 0;
            astc_mode0_or_18((uint32_t)fVar8,
                             (color_rgba (*) [4])CONCAT44(uVar4,in_stack_fffffffffffff6f8),pResults,
                             total_results_00,
                             (bc7enc_compress_block_params *)in_stack_fffffffffffff6e0._M_cur,
                             (uint8_t *)
                             CONCAT44(in_stack_fffffffffffff6dc,in_stack_fffffffffffff6d8));
            if (iVar11 != 1) {
              __assert_fail("total_results == 1",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                            ,0xff0,
                            "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                           );
            }
            local_a08 = local_818;
            uVar12 = 1;
            in_stack_fffffffffffff5e0 = in_stack_fffffffffffff83c;
            do {
              color_rgba::color_rgba(local_a08);
              local_a08 = local_a08 + 1;
            } while (local_a08 != (color_rgba *)&stack0xfffffffffffff828);
            in_stack_fffffffffffff5dc = local_7c8;
            in_stack_fffffffffffff83c = in_stack_fffffffffffff5e0;
            color_rgba::get_color32((color_rgba *)in_stack_fffffffffffff5a8);
            bVar2 = basist::unpack_uastc
                              (in_stack_fffffffffffff840,in_stack_fffffffffffff83c,
                               (color32 *)CONCAT44(uVar12,in_stack_fffffffffffff830),
                               in_stack_fffffffffffff828,in_stack_fffffffffffff820,
                               (bool)in_stack_fffffffffffff81f);
            in_stack_fffffffffffff5d8 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff5d8);
            if (!bVar2) {
              __assert_fail("success",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                            ,0xff6,
                            "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                           );
            }
            in_stack_fffffffffffff7d8 = (unpacked_uastc_block *)0x0;
            for (in_stack_fffffffffffff7d4 = 0; in_stack_fffffffffffff7d4 < 0x10;
                in_stack_fffffffffffff7d4 = in_stack_fffffffffffff7d4 + 1) {
              in_stack_fffffffffffff5d4 =
                   color_distance(SUB41(in_stack_fffffffffffff5e0 >> 0x18,0),
                                  (color_rgba *)
                                  CONCAT44(in_stack_fffffffffffff5dc,in_stack_fffffffffffff5d8),
                                  (color_rgba *)
                                  CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                                  SUB41(in_stack_fffffffffffff5cc >> 0x18,0));
              in_stack_fffffffffffff7d8 =
                   (unpacked_uastc_block *)
                   ((in_stack_fffffffffffff7d8->m_astc).m_endpoints +
                   ((ulong)in_stack_fffffffffffff5d4 - 0x15));
            }
            if (in_stack_fffffffffffff7d8 < local_720) {
              for (in_stack_fffffffffffff7d0 = 0; in_stack_fffffffffffff7d0 < 0x10;
                  in_stack_fffffffffffff7d0 = in_stack_fffffffffffff7d0 + 1) {
                if (local_6a5[in_stack_fffffffffffff7d0] != acStack_799[in_stack_fffffffffffff7d0])
                {
                  __assert_fail("unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]"
                                ,
                                "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/basisu_uastc_enc.cpp"
                                ,0x1004,
                                "bool basisu::uastc_rdo_blocks(uint32_t, uint32_t, basist::uastc_block *, const color_rgba *, const uastc_rdo_params &, uint32_t, uint32_t &, uint32_t &, uint32_t &, uint32_t &)"
                               );
                }
              }
              memcpy(local_6cc,&stack0xfffffffffffff840,0x68);
              *in_stack_00000010 = *in_stack_00000010 + 1;
            }
          }
          bVar2 = uastc_recompute_hints
                            (in_stack_fffffffffffff798,in_stack_fffffffffffff790,
                             in_stack_fffffffffffff78c,
                             (unpacked_uastc_block *)
                             CONCAT71(in_stack_fffffffffffff781,in_stack_fffffffffffff780));
          in_stack_fffffffffffff5d0 = CONCAT13(bVar2,(int3)in_stack_fffffffffffff5d0);
          if (!bVar2) {
            local_1 = 0;
            goto LAB_00539edb;
          }
          puVar7 = (undefined8 *)(local_18 + (ulong)local_74 * 0x10);
          *puVar7 = local_370;
          puVar7[1] = local_368;
        }
        codesize = (uint32_t)((ulong)in_stack_fffffffffffff5c0 >> 0x20);
        in_stack_fffffffffffff5cc = minimum<unsigned_int>(0x40,local_2d0);
        in_stack_fffffffffffff5c0 =
             (tracked_stat *)
             read_bits((uint8_t *)CONCAT44(in_stack_fffffffffffff5d4,in_stack_fffffffffffff5d0),
                       (uint32_t *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                       codesize);
        selector_bitsequence::selector_bitsequence
                  ((selector_bitsequence *)&stack0xfffffffffffff788,local_2cc,
                   (uint64_t)in_stack_fffffffffffff5c0);
        std::make_pair<basisu::selector_bitsequence,unsigned_int&>
                  ((selector_bitsequence *)
                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   (uint *)in_stack_fffffffffffff5a8);
        _Var10 = std::
                 unordered_map<basisu::selector_bitsequence,unsigned_int,basisu::selector_bitsequence_hash,std::equal_to<basisu::selector_bitsequence>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>>
                 ::insert<std::pair<basisu::selector_bitsequence,unsigned_int>>
                           ((unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
                             *)in_stack_fffffffffffff5c0,
                            (pair<basisu::selector_bitsequence,_unsigned_int> *)
                            in_stack_fffffffffffff5b8._M_cur);
        in_stack_fffffffffffff5b8._M_cur =
             (__node_type *)
             _Var10.first.
             super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
             ._M_cur;
        in_stack_fffffffffffff780 = _Var10.second;
        in_stack_fffffffffffff5b4 =
             CONCAT13(in_stack_fffffffffffff780,(int3)in_stack_fffffffffffff5b4);
        if (((undefined1  [16])_Var10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          in_stack_fffffffffffff5b0 = local_74;
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                   ::operator*((_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                                *)0x539ea9);
          ppVar5->second = in_stack_fffffffffffff5b0;
        }
      }
      else {
        selector_bitsequence::selector_bitsequence(local_318,local_2cc,(uint64_t)total_results_00);
        std::make_pair<basisu::selector_bitsequence,unsigned_int&>
                  ((selector_bitsequence *)
                   CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                   (uint *)in_stack_fffffffffffff5a8);
        _Var10 = std::
                 unordered_map<basisu::selector_bitsequence,unsigned_int,basisu::selector_bitsequence_hash,std::equal_to<basisu::selector_bitsequence>,std::allocator<std::pair<basisu::selector_bitsequence_const,unsigned_int>>>
                 ::insert<std::pair<basisu::selector_bitsequence,unsigned_int>>
                           ((unordered_map<basisu::selector_bitsequence,_unsigned_int,_basisu::selector_bitsequence_hash,_std::equal_to<basisu::selector_bitsequence>,_std::allocator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>_>_>
                             *)in_stack_fffffffffffff5c0,
                            (pair<basisu::selector_bitsequence,_unsigned_int> *)
                            in_stack_fffffffffffff5b8._M_cur);
        in_stack_fffffffffffff6e0._M_cur =
             (__node_type *)
             _Var10.first.
             super__Node_iterator_base<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false>
             ._M_cur;
        local_320 = _Var10.second;
        in_stack_fffffffffffff6dc = CONCAT13(local_320,(int3)in_stack_fffffffffffff6dc);
        local_328._M_cur = in_stack_fffffffffffff6e0._M_cur;
        local_2f0._M_cur = in_stack_fffffffffffff6e0._M_cur;
        local_2e8 = local_320;
        if (((undefined1  [16])_Var10 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          in_stack_fffffffffffff6d8 = local_74;
          ppVar5 = std::__detail::
                   _Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                   ::operator*((_Node_iterator<std::pair<const_basisu::selector_bitsequence,_unsigned_int>,_false,_false>
                                *)0x539000);
          ppVar5->second = in_stack_fffffffffffff6d8;
        }
        *in_stack_00000008 = *in_stack_00000008 + 1;
      }
    }
    local_74 = local_74 + 1;
  } while( true );
}

Assistant:

static bool uastc_rdo_blocks(uint32_t first_index, uint32_t last_index, basist::uastc_block* pBlocks, const color_rgba* pBlock_pixels, const uastc_rdo_params& params, uint32_t flags, 
		uint32_t &total_skipped, uint32_t &total_refined, uint32_t &total_modified, uint32_t &total_smooth)
	{
		debug_printf("uastc_rdo_blocks: Processing blocks %u to %u\n", first_index, last_index);

		const int total_blocks_to_check = basisu::maximum<uint32_t>(1U, params.m_lz_dict_size / sizeof(basist::uastc_block));
		const bool perceptual = false;

		std::unordered_map<selector_bitsequence, uint32_t, selector_bitsequence_hash> selector_history;
						
		for (uint32_t block_index = first_index; block_index < last_index; block_index++)
		{
			const basist::uastc_block& blk = pBlocks[block_index];
			const color_rgba* pPixels = &pBlock_pixels[16 * block_index];

			unpacked_uastc_block unpacked_blk;
			if (!unpack_uastc(blk, unpacked_blk, false, true))
				return false;

			const uint32_t block_mode = unpacked_blk.m_mode;
			if (block_mode == UASTC_MODE_INDEX_SOLID_COLOR)
				continue;

			tracked_stat r_stats, g_stats, b_stats, a_stats;

			for (uint32_t i = 0; i < 16; i++)
			{
				r_stats.update(pPixels[i].r);
				g_stats.update(pPixels[i].g);
				b_stats.update(pPixels[i].b);
				a_stats.update(pPixels[i].a);
			}

			const float max_std_dev = basisu::maximum<float>(basisu::maximum<float>(basisu::maximum(r_stats.get_std_dev(), g_stats.get_std_dev()), b_stats.get_std_dev()), a_stats.get_std_dev());

			float yl = clamp<float>(max_std_dev / params.m_max_smooth_block_std_dev, 0.0f, 1.0f);
			yl = yl * yl;
			const float smooth_block_error_scale = lerp<float>(params.m_smooth_block_max_error_scale, 1.0f, yl);
			if (smooth_block_error_scale > 1.0f)
				total_smooth++;

			color_rgba decoded_uastc_block[4][4];
			if (!unpack_uastc(unpacked_blk, (basist::color32*)decoded_uastc_block, false))
				return false;

			uint64_t uastc_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_uastc_block)[i], true);

			// Transcode to BC7
			bc7_optimization_results b7_results;
			if (!transcode_uastc_to_bc7(unpacked_blk, b7_results))
				return false;

			basist::bc7_block b7_block;
			basist::encode_bc7_block(&b7_block, &b7_results);

			color_rgba decoded_b7_blk[4][4];
			unpack_block(texture_format::cBC7, &b7_block, &decoded_b7_blk[0][0]);
						
			uint64_t bc7_err = 0;
			for (uint32_t i = 0; i < 16; i++)
				bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_b7_blk)[i], true);

			uint64_t cur_err = (uastc_err + bc7_err) / 2;

			// Divide by 16*4 to compute RMS error
			const float cur_ms_err = (float)cur_err * (1.0f / 64.0f);
			const float cur_rms_err = sqrt(cur_ms_err);

			const uint32_t first_sel_bit = g_uastc_mode_selector_bits[block_mode][0];
			const uint32_t total_sel_bits = g_uastc_mode_selector_bits[block_mode][1];
			assert(first_sel_bit + total_sel_bits <= 128);
			assert(total_sel_bits > 0);

			uint32_t cur_bit_offset = first_sel_bit;
			uint64_t cur_sel_bits = read_bits((const uint8_t*)&blk, cur_bit_offset, basisu::minimum(64U, total_sel_bits));

			if (cur_rms_err >= params.m_skip_block_rms_thresh)
			{
				auto cur_search_res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, cur_sel_bits), block_index));

				// Block already has too much error, so don't mess with it.
				if (!cur_search_res.second)
					(*cur_search_res.first).second = block_index;

				total_skipped++;
				continue;
			}

			int cur_bits;
			auto cur_find_res = selector_history.find(selector_bitsequence(first_sel_bit, cur_sel_bits));
			if (cur_find_res == selector_history.end())
			{
				// Wasn't found - wildly estimate literal cost
				//cur_bits = (total_sel_bits * 5) / 4;
				cur_bits = (total_sel_bits * params.m_lz_literal_cost) / 100;
			}
			else
			{
				// Was found - wildly estimate match cost
				uint32_t match_block_index = cur_find_res->second;
				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				cur_bits = compute_match_cost_estimate(block_dist_in_bytes);
			}

			int first_block_to_check = basisu::maximum<int>(first_index, block_index - total_blocks_to_check);
			int last_block_to_check = block_index - 1;

			basist::uastc_block best_block(blk);
			uint32_t best_block_index = block_index;

			float best_t = cur_ms_err * smooth_block_error_scale + cur_bits * params.m_lambda;

			// Now scan through previous blocks, insert their selector bit patterns into the current block, and find 
			// selector bit patterns which don't increase the overall block error too much.
			for (int prev_block_index = last_block_to_check; prev_block_index >= first_block_to_check; --prev_block_index)
			{
				const basist::uastc_block& prev_blk = pBlocks[prev_block_index];

				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, basisu::minimum(64U, total_sel_bits));

				int match_block_index = prev_block_index;
				auto res = selector_history.find(selector_bitsequence(first_sel_bit, sel_bits));
				if (res != selector_history.end())
					match_block_index = res->second;
				// Have we already checked this bit pattern? If so then skip this block.
				if (match_block_index > prev_block_index)
					continue;

				unpacked_uastc_block unpacked_prev_blk;
				if (!unpack_uastc(prev_blk, unpacked_prev_blk, false, true))
					return false;

				basist::uastc_block trial_blk(blk);

				set_block_bits((uint8_t*)&trial_blk, sel_bits, basisu::minimum(64U, total_sel_bits), first_sel_bit);

				if (total_sel_bits > 64)
				{
					sel_bits = read_bits((const uint8_t*)&prev_blk, bit_offset, total_sel_bits - 64U);

					set_block_bits((uint8_t*)&trial_blk, sel_bits, total_sel_bits - 64U, first_sel_bit + basisu::minimum(64U, total_sel_bits));
				}

				unpacked_uastc_block unpacked_trial_blk;
				if (!unpack_uastc(trial_blk, unpacked_trial_blk, false, true))
					continue;

				color_rgba decoded_trial_uastc_block[4][4];
				if (!unpack_uastc(unpacked_trial_blk, (basist::color32*)decoded_trial_uastc_block, false))
					continue;

				uint64_t trial_uastc_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

				// Transcode trial to BC7, compute error
				bc7_optimization_results trial_b7_results;
				if (!transcode_uastc_to_bc7(unpacked_trial_blk, trial_b7_results))
					return false;

				basist::bc7_block trial_b7_block;
				basist::encode_bc7_block(&trial_b7_block, &trial_b7_results);

				color_rgba decoded_trial_b7_blk[4][4];
				unpack_block(texture_format::cBC7, &trial_b7_block, &decoded_trial_b7_blk[0][0]);

				uint64_t trial_bc7_err = 0;
				for (uint32_t i = 0; i < 16; i++)
					trial_bc7_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_b7_blk)[i], true);

				uint64_t trial_err = (trial_uastc_err + trial_bc7_err) / 2;

				const float trial_ms_err = (float)trial_err * (1.0f / 64.0f);
				const float trial_rms_err = sqrtf(trial_ms_err);

				if (trial_rms_err > cur_rms_err * params.m_max_allowed_rms_increase_ratio)
					continue;

				const int block_dist_in_bytes = (block_index - match_block_index) * 16;
				const int match_bits = compute_match_cost_estimate(block_dist_in_bytes);

				float t = trial_ms_err * smooth_block_error_scale + match_bits * params.m_lambda;
				if (t < best_t)
				{
					best_t = t;
					best_block_index = prev_block_index;

					best_block = trial_blk;
				}

			} // prev_block_index

			if (best_block_index != block_index)
			{
				total_modified++;

				unpacked_uastc_block unpacked_best_blk;
				if (!unpack_uastc(best_block, unpacked_best_blk, false, false))
					return false;

				if ((params.m_endpoint_refinement) && (block_mode == 0))
				{
					// Attempt to refine mode 0 block's endpoints, using the new selectors. This doesn't help much, but it does help.
					// TODO: We could do this with the other modes too.
					color_rgba decoded_best_uastc_block[4][4];
					if (!unpack_uastc(unpacked_best_blk, (basist::color32*)decoded_best_uastc_block, false))
						return false;

					// Compute the block's current error (with the modified selectors).
					uint64_t best_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						best_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_best_uastc_block)[i], true);

					bc7enc_compress_block_params comp_params;
					memset(&comp_params, 0, sizeof(comp_params));
					comp_params.m_max_partitions_mode1 = 64;
					comp_params.m_least_squares_passes = 1;
					comp_params.m_weights[0] = 1;
					comp_params.m_weights[1] = 1;
					comp_params.m_weights[2] = 1;
					comp_params.m_weights[3] = 1;
					comp_params.m_uber_level = 0;

					uastc_encode_results results;
					uint32_t total_results = 0;
					astc_mode0_or_18(0, (color_rgba(*)[4])pPixels, &results, total_results, comp_params, unpacked_best_blk.m_astc.m_weights);
					assert(total_results == 1);

					// See if the overall error has actually gone done.

					color_rgba decoded_trial_uastc_block[4][4];
					bool success = unpack_uastc(results.m_uastc_mode, results.m_common_pattern, results.m_solid_color.get_color32(), results.m_astc, (basist::color32*) & decoded_trial_uastc_block[0][0], false);
					assert(success);
					
					BASISU_NOTE_UNUSED(success);

					uint64_t trial_uastc_err = 0;
					for (uint32_t i = 0; i < 16; i++)
						trial_uastc_err += color_distance(perceptual, pPixels[i], ((color_rgba*)decoded_trial_uastc_block)[i], true);

					if (trial_uastc_err < best_uastc_err)
					{
						// The error went down, so accept the new endpoints.

						// Ensure the selectors haven't changed, otherwise we'll invalidate the LZ matches.
						for (uint32_t i = 0; i < 16; i++)
							assert(unpacked_best_blk.m_astc.m_weights[i] == results.m_astc.m_weights[i]);

						unpacked_best_blk.m_astc = results.m_astc;

						total_refined++;
					}
				} // if ((params.m_endpoint_refinement) && (block_mode == 0))

				// The selectors have changed, so go recompute the block hints.
				if (!uastc_recompute_hints(&best_block, pPixels, flags, &unpacked_best_blk))
					return false;

				// Write the modified block
				pBlocks[block_index] = best_block;
			
			} // if (best_block_index != block_index)

			{
				uint32_t bit_offset = first_sel_bit;
				uint64_t sel_bits = read_bits((const uint8_t*)&best_block, bit_offset, basisu::minimum(64U, total_sel_bits));

				auto res = selector_history.insert(std::make_pair(selector_bitsequence(first_sel_bit, sel_bits), block_index));
				if (!res.second)
					(*res.first).second = block_index;
			}

		} // block_index

		return true;
	}